

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgzf.c
# Opt level: O2

int bgzf_useek(BGZF *fp,long uoffset,int where)

{
  bgzidx_t *pbVar1;
  uint64_t uVar2;
  int iVar3;
  int iVar4;
  off_t oVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  
  if ((*(uint *)fp & 0x60000000) == 0) {
    oVar5 = hseek(fp->fp,uoffset,0);
    if (-1 < oVar5) {
      fp->block_length = 0;
      fp->block_offset = 0;
      fp->block_address = uoffset;
      bgzf_read_block(fp);
      fp->uncompressed_address = uoffset;
      return 0;
    }
  }
  else {
    pbVar1 = fp->idx;
    if (pbVar1 == (bgzidx_t *)0x0) {
      *(uint *)fp = *(uint *)fp | 4;
      return -1;
    }
    iVar4 = pbVar1->noffs + -1;
    iVar3 = 0;
    while (iVar6 = iVar3, iVar6 <= iVar4) {
      iVar7 = (int)((double)(iVar6 + iVar4) * 0.5);
      iVar3 = iVar7 + 1;
      if ((ulong)uoffset < pbVar1->offs[iVar7].uaddr) {
        iVar4 = iVar7 + -1;
        iVar3 = iVar6;
      }
    }
    lVar8 = (long)iVar6 + -1;
    oVar5 = hseek(fp->fp,pbVar1->offs[lVar8].caddr,0);
    if (-1 < oVar5) {
      fp->block_length = 0;
      fp->block_address = fp->idx->offs[lVar8].caddr;
      fp->block_offset = 0;
      iVar4 = bgzf_read_block(fp);
      if (iVar4 < 0) {
        return -1;
      }
      uVar2 = fp->idx->offs[lVar8].uaddr;
      if ((uoffset != uVar2) &&
         (iVar4 = (int)uoffset - (int)uVar2, fp->block_offset = iVar4, fp->block_length < iVar4)) {
        __assert_fail("fp->block_offset <= fp->block_length",
                      "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/bgzf.c"
                      ,0x45a,"int bgzf_useek(BGZF *, long, int)");
      }
      fp->uncompressed_address = uoffset;
      return 0;
    }
  }
  *(byte *)fp = *(byte *)fp | 4;
  return -1;
}

Assistant:

int bgzf_useek(BGZF *fp, long uoffset, int where)
{
    if ( !fp->is_compressed )
    {
        if (hseek(fp->fp, uoffset, SEEK_SET) < 0)
        {
            fp->errcode |= BGZF_ERR_IO;
            return -1;
        }
        fp->block_length = 0;  // indicates current block has not been loaded
        fp->block_address = uoffset;
        fp->block_offset = 0;
        bgzf_read_block(fp);
        fp->uncompressed_address = uoffset;
        return 0;
    }

    if ( !fp->idx )
    {
        fp->errcode |= BGZF_ERR_IO;
        return -1;
    }

    // binary search
    int ilo = 0, ihi = fp->idx->noffs - 1;
    while ( ilo<=ihi )
    {
        int i = (ilo+ihi)*0.5;
        if ( uoffset < fp->idx->offs[i].uaddr ) ihi = i - 1;
        else if ( uoffset >= fp->idx->offs[i].uaddr ) ilo = i + 1;
        else break;
    }
    int i = ilo-1;
    if (hseek(fp->fp, fp->idx->offs[i].caddr, SEEK_SET) < 0)
    {
        fp->errcode |= BGZF_ERR_IO;
        return -1;
    }
    fp->block_length = 0;  // indicates current block has not been loaded
    fp->block_address = fp->idx->offs[i].caddr;
    fp->block_offset = 0;
    if ( bgzf_read_block(fp) < 0 ) return -1;
    if ( uoffset - fp->idx->offs[i].uaddr > 0 )
    {
        fp->block_offset = uoffset - fp->idx->offs[i].uaddr;
        assert( fp->block_offset <= fp->block_length );     // todo: skipped, unindexed, blocks
    }
    fp->uncompressed_address = uoffset;
    return 0;
}